

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IMutableContext * Catch::getCurrentMutableContext(void)

{
  Context *this;
  
  if ((anonymous_namespace)::currentContext == (Context *)0x0) {
    this = (Context *)operator_new(0x50);
    Context::Context(this);
    (anonymous_namespace)::currentContext = this;
  }
  return &(anonymous_namespace)::currentContext->super_IMutableContext;
}

Assistant:

IMutableContext& getCurrentMutableContext() {
		if (!currentContext)
			currentContext = new Context();
		return *currentContext;
	}